

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

MaybeResult<wasm::Ok> *
wasm::WATParser::memory<wasm::WATParser::ParseModuleTypesCtx>
          (MaybeResult<wasm::Ok> *__return_storage_ptr__,ParseModuleTypesCtx *ctx)

{
  __index_type *__return_storage_ptr___00;
  bool bVar1;
  size_t sVar2;
  Name *pNVar3;
  Err *pEVar4;
  Ok *pOVar5;
  vector<wasm::Name,_std::allocator<wasm::Name>_> *pvVar6;
  ImportNames *pIVar7;
  basic_string_view<char,_std::char_traits<char>_> bVar8;
  Ok local_439;
  Err local_438;
  Err *local_418;
  Err *err_5;
  Result<wasm::Ok> _val_5;
  Err *err_4;
  undefined1 local_3a8 [8];
  Result<wasm::Ok> _val_4;
  string local_378;
  Err local_358;
  Err local_338;
  Err *local_318;
  Err *err_3;
  Result<wasm::Ok> _val_3;
  undefined1 local_2e0 [8];
  Result<wasm::Ok> type;
  Type local_2b0;
  Ok local_2a2;
  allocator<char> local_2a1;
  string local_2a0;
  Err local_280;
  Err local_260;
  Err *local_240;
  Err *err_2;
  Result<wasm::Ok> _val_2;
  Result<wasm::Ok> datastr;
  string local_1e0;
  Err local_1c0;
  basic_string_view<char,_std::char_traits<char>_> local_1a0;
  optional<wasm::Ok> local_18c;
  optional<wasm::Ok> local_18a;
  undefined1 auStack_188 [4];
  optional<wasm::Ok> data;
  optional<wasm::Ok> mtype;
  BasicType local_164;
  undefined1 local_160 [4];
  BasicType addressType;
  Err *local_140;
  Err *err_1;
  MaybeResult<wasm::WATParser::ImportNames> _val_1;
  MaybeResult<wasm::WATParser::ImportNames> import;
  Err local_e0;
  Err *local_c0;
  Err *err;
  undefined1 local_a8 [8];
  Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> _val;
  Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> exports;
  optional<wasm::Name> id;
  Name name;
  undefined4 local_20;
  size_t pos;
  ParseModuleTypesCtx *ctx_local;
  
  sVar2 = Lexer::getPos(&ctx->in);
  bVar8 = sv("memory",6);
  bVar1 = Lexer::takeSExprStart(&ctx->in,bVar8);
  if (!bVar1) {
    MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  wasm::Name::Name((Name *)&id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                            super__Optional_payload_base<wasm::Name>._M_engaged);
  Lexer::takeID((optional<wasm::Name> *)
                ((long)&exports.val.
                        super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                        .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                        super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                        super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                        super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err> + 0x20),&ctx->in)
  ;
  bVar1 = std::optional::operator_cast_to_bool
                    ((optional *)
                     ((long)&exports.val.
                             super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                             .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                             super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                             super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                             super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err> + 0x20));
  if (bVar1) {
    pNVar3 = std::optional<wasm::Name>::operator*
                       ((optional<wasm::Name> *)
                        ((long)&exports.val.
                                super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                                .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                                super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                                super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                                super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err> + 0x20));
    wasm::Name::operator=
              ((Name *)&id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                        super__Optional_payload_base<wasm::Name>._M_engaged,pNVar3);
  }
  __return_storage_ptr___00 =
       (__index_type *)
       ((long)&_val.val.
               super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>.
               super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
               super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
               super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
               super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err> + 0x20);
  inlineExports((Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *)
                __return_storage_ptr___00,&ctx->in);
  Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>::Result
            ((Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *)local_a8,
             (Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *)
             __return_storage_ptr___00);
  local_c0 = Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>::getErr
                       ((Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *)local_a8);
  bVar1 = local_c0 != (Err *)0x0;
  if (bVar1) {
    wasm::Err::Err(&local_e0,local_c0);
    MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_e0);
    wasm::Err::~Err(&local_e0);
  }
  Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>::~Result
            ((Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *)local_a8);
  if (bVar1) goto LAB_02418833;
  inlineImport((MaybeResult<wasm::WATParser::ImportNames> *)
               ((long)&_val_1.val.
                       super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                       .
                       super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                       .super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err> +
               0x20),&ctx->in);
  MaybeResult<wasm::WATParser::ImportNames>::MaybeResult
            ((MaybeResult<wasm::WATParser::ImportNames> *)&err_1,
             (MaybeResult<wasm::WATParser::ImportNames> *)
             ((long)&_val_1.val.
                     super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err> +
             0x20));
  local_140 = MaybeResult<wasm::WATParser::ImportNames>::getErr
                        ((MaybeResult<wasm::WATParser::ImportNames> *)&err_1);
  bVar1 = local_140 == (Err *)0x0;
  if (!bVar1) {
    wasm::Err::Err((Err *)local_160,local_140);
    MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,(Err *)local_160);
    wasm::Err::~Err((Err *)local_160);
  }
  MaybeResult<wasm::WATParser::ImportNames>::~MaybeResult
            ((MaybeResult<wasm::WATParser::ImportNames> *)&err_1);
  if (bVar1) {
    local_164 = i32;
    bVar8 = sv("i64",3);
    bVar1 = Lexer::takeKeyword(&ctx->in,bVar8);
    if (bVar1) {
      local_164 = i64;
    }
    else {
      _auStack_188 = sv("i32",3);
      Lexer::takeKeyword(&ctx->in,_auStack_188);
    }
    std::optional<wasm::Ok>::optional(&local_18a);
    std::optional<wasm::Ok>::optional(&local_18c);
    local_1a0 = sv("data",4);
    bVar1 = Lexer::takeSExprStart(&ctx->in,local_1a0);
    if (bVar1) {
      bVar1 = wasm::MaybeResult::operator_cast_to_bool
                        ((MaybeResult *)
                         ((long)&_val_1.val.
                                 super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                                 .
                                 super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                                 .
                                 super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                                 .
                                 super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                                 .
                                 super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                         + 0x20));
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1e0,"imported memories cannot have inline data",
                   (allocator<char> *)
                   ((long)&datastr.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x27));
        Lexer::err(&local_1c0,&ctx->in,&local_1e0);
        MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_1c0);
        wasm::Err::~Err(&local_1c0);
        std::__cxx11::string::~string((string *)&local_1e0);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&datastr.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x27));
      }
      else {
        datastring<wasm::WATParser::ParseModuleTypesCtx>
                  ((Result<wasm::Ok> *)
                   ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),ctx);
        Result<wasm::Ok>::Result
                  ((Result<wasm::Ok> *)&err_2,
                   (Result<wasm::Ok> *)
                   ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
        local_240 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_2);
        bVar1 = local_240 != (Err *)0x0;
        if (bVar1) {
          wasm::Err::Err(&local_260,local_240);
          MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_260);
          wasm::Err::~Err(&local_260);
        }
        Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_2);
        if (!bVar1) {
          bVar1 = Lexer::takeRParen(&ctx->in);
          if (bVar1) {
            wasm::Type::Type(&local_2b0,local_164);
            Result<wasm::Ok>::operator*
                      ((Result<wasm::Ok> *)
                       ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
            ParseModuleTypesCtx::getLimitsFromData(ctx);
            ParseModuleTypesCtx::makeMemType(ctx,local_2b0.id,0);
            std::optional<wasm::Ok>::operator=(&local_18a,&local_2a2);
            pOVar5 = Result<wasm::Ok>::operator*
                               ((Result<wasm::Ok> *)
                                ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                        super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                        super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                        super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
            std::optional<wasm::Ok>::operator=(&local_18c,pOVar5);
            bVar1 = false;
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2a0,"expected end of inline data",&local_2a1);
            Lexer::err(&local_280,&ctx->in,&local_2a0);
            MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_280);
            wasm::Err::~Err(&local_280);
            std::__cxx11::string::~string((string *)&local_2a0);
            std::allocator<char>::~allocator(&local_2a1);
            bVar1 = true;
          }
        }
        Result<wasm::Ok>::~Result
                  ((Result<wasm::Ok> *)
                   ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
        if (!bVar1) goto LAB_02418473;
      }
    }
    else {
      wasm::Type::Type((Type *)((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),local_164
                      );
      memtypeContinued<wasm::WATParser::ParseModuleTypesCtx>
                ((Result<wasm::Ok> *)local_2e0,ctx,
                 (Type)_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_);
      Result<wasm::Ok>::Result((Result<wasm::Ok> *)&err_3,(Result<wasm::Ok> *)local_2e0);
      pEVar4 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_3);
      local_318 = pEVar4;
      if (pEVar4 != (Err *)0x0) {
        wasm::Err::Err(&local_338,pEVar4);
        MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_338);
        wasm::Err::~Err(&local_338);
      }
      Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_3);
      if (pEVar4 == (Err *)0x0) {
        pOVar5 = Result<wasm::Ok>::operator*((Result<wasm::Ok> *)local_2e0);
        std::optional<wasm::Ok>::operator=(&local_18a,pOVar5);
      }
      Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_2e0);
      if (pEVar4 == (Err *)0x0) {
LAB_02418473:
        bVar1 = Lexer::takeRParen(&ctx->in);
        if (bVar1) {
          pvVar6 = Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>::operator*
                             ((Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *)
                              ((long)&_val.val.
                                      super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                                      .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                                      super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                                      super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                                      super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err> +
                              0x20));
          pIVar7 = MaybeResult<wasm::WATParser::ImportNames>::getPtr
                             ((MaybeResult<wasm::WATParser::ImportNames> *)
                              ((long)&_val_1.val.
                                      super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                                      .
                                      super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                                      .
                                      super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                                      .
                                      super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                                      .
                                      super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                              + 0x20));
          std::optional<wasm::Ok>::operator*(&local_18a);
          local_20 = (undefined4)sVar2;
          ParseModuleTypesCtx::addMemory
                    (local_3a8,ctx,
                     id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                     super__Optional_payload_base<wasm::Name>._16_8_,name.super_IString.str._M_len,
                     pvVar6,pIVar7,local_20);
          pEVar4 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_3a8);
          if (pEVar4 != (Err *)0x0) {
            wasm::Err::Err((Err *)((long)&_val_5.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                          super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                          super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),pEVar4
                          );
            MaybeResult<wasm::Ok>::MaybeResult
                      (__return_storage_ptr__,
                       (Err *)((long)&_val_5.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                      super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                      super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                      super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
            wasm::Err::~Err((Err *)((long)&_val_5.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
          }
          Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_3a8);
          if (pEVar4 == (Err *)0x0) {
            bVar1 = std::optional::operator_cast_to_bool((optional *)&local_18c);
            if (bVar1) {
              pOVar5 = std::optional<wasm::Ok>::operator*(&local_18c);
              ParseModuleTypesCtx::addImplicitData((Result<wasm::Ok> *)&err_5,ctx,pOVar5);
              local_418 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_5);
              bVar1 = local_418 != (Err *)0x0;
              if (bVar1) {
                wasm::Err::Err(&local_438,local_418);
                MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_438);
                wasm::Err::~Err(&local_438);
              }
              Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_5);
              if (bVar1) goto LAB_02418817;
            }
            MaybeResult<wasm::Ok>::MaybeResult<wasm::Ok>(__return_storage_ptr__,&local_439);
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_378,"expected end of memory declaration",
                     (allocator<char> *)
                     ((long)&_val_4.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x27));
          Lexer::err(&local_358,&ctx->in,&local_378);
          MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_358);
          wasm::Err::~Err(&local_358);
          std::__cxx11::string::~string((string *)&local_378);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&_val_4.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x27));
        }
      }
    }
  }
LAB_02418817:
  MaybeResult<wasm::WATParser::ImportNames>::~MaybeResult
            ((MaybeResult<wasm::WATParser::ImportNames> *)
             ((long)&_val_1.val.
                     super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err> +
             0x20));
LAB_02418833:
  Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>::~Result
            ((Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *)
             ((long)&_val.val.
                     super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                     .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                     super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                     super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                     super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err> + 0x20));
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<> memory(Ctx& ctx) {
  auto pos = ctx.in.getPos();
  if (!ctx.in.takeSExprStart("memory"sv)) {
    return {};
  }

  Name name;
  if (auto id = ctx.in.takeID()) {
    name = *id;
  }

  auto exports = inlineExports(ctx.in);
  CHECK_ERR(exports);

  auto import = inlineImport(ctx.in);
  CHECK_ERR(import);

  auto addressType = Type::i32;
  if (ctx.in.takeKeyword("i64"sv)) {
    addressType = Type::i64;
  } else {
    ctx.in.takeKeyword("i32"sv);
  }

  std::optional<typename Ctx::MemTypeT> mtype;
  std::optional<typename Ctx::DataStringT> data;
  if (ctx.in.takeSExprStart("data"sv)) {
    if (import) {
      return ctx.in.err("imported memories cannot have inline data");
    }
    auto datastr = datastring(ctx);
    CHECK_ERR(datastr);
    if (!ctx.in.takeRParen()) {
      return ctx.in.err("expected end of inline data");
    }
    mtype =
      ctx.makeMemType(addressType, ctx.getLimitsFromData(*datastr), false);
    data = *datastr;
  } else {
    auto type = memtypeContinued(ctx, addressType);
    CHECK_ERR(type);
    mtype = *type;
  }

  if (!ctx.in.takeRParen()) {
    return ctx.in.err("expected end of memory declaration");
  }

  CHECK_ERR(ctx.addMemory(name, *exports, import.getPtr(), *mtype, pos));

  if (data) {
    CHECK_ERR(ctx.addImplicitData(std::move(*data)));
  }

  return Ok{};
}